

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_encoder.c
# Opt level: O0

void length_update_prices(lzma_length_encoder *lc,uint32_t pos_state)

{
  uint uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint local_34;
  uint32_t table_size;
  uint32_t i;
  uint32_t *prices;
  uint32_t b1;
  uint32_t b0;
  uint32_t a1;
  uint32_t a0;
  uint32_t pos_state_local;
  lzma_length_encoder *lc_local;
  
  uVar1 = lc->table_size;
  lc->counters[pos_state] = uVar1;
  uVar2 = rc_bit_0_price(lc->choice);
  uVar3 = rc_bit_1_price(lc->choice);
  uVar4 = rc_bit_0_price(lc->choice2);
  uVar5 = rc_bit_1_price(lc->choice2);
  for (local_34 = 0; local_34 < uVar1 && local_34 < 8; local_34 = local_34 + 1) {
    uVar6 = rc_bittree_price(lc->low[pos_state],3,local_34);
    lc->prices[pos_state][local_34] = uVar2 + uVar6;
  }
  for (; local_34 < uVar1 && local_34 < 0x10; local_34 = local_34 + 1) {
    uVar2 = rc_bittree_price(lc->mid[pos_state],3,local_34 - 8);
    lc->prices[pos_state][local_34] = uVar3 + uVar4 + uVar2;
  }
  for (; local_34 < uVar1; local_34 = local_34 + 1) {
    uVar2 = rc_bittree_price(lc->high,8,local_34 - 0x10);
    lc->prices[pos_state][local_34] = uVar3 + uVar5 + uVar2;
  }
  return;
}

Assistant:

static void
length_update_prices(lzma_length_encoder *lc, const uint32_t pos_state)
{
	uint32_t a0, a1, b0, b1;
	uint32_t *prices;
	uint32_t i;

	const uint32_t table_size = lc->table_size;
	lc->counters[pos_state] = table_size;

	a0 = rc_bit_0_price(lc->choice);
	a1 = rc_bit_1_price(lc->choice);
	b0 = a1 + rc_bit_0_price(lc->choice2);
	b1 = a1 + rc_bit_1_price(lc->choice2);
	prices = lc->prices[pos_state];

	for (i = 0; i < table_size && i < LEN_LOW_SYMBOLS; ++i)
		prices[i] = a0 + rc_bittree_price(lc->low[pos_state],
				LEN_LOW_BITS, i);

	for (; i < table_size && i < LEN_LOW_SYMBOLS + LEN_MID_SYMBOLS; ++i)
		prices[i] = b0 + rc_bittree_price(lc->mid[pos_state],
				LEN_MID_BITS, i - LEN_LOW_SYMBOLS);

	for (; i < table_size; ++i)
		prices[i] = b1 + rc_bittree_price(lc->high, LEN_HIGH_BITS,
				i - LEN_LOW_SYMBOLS - LEN_MID_SYMBOLS);

	return;
}